

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O3

void test_1d_dynamic<1ul>(void)

{
  pointer piVar1;
  undefined8 uVar2;
  int *t;
  vector<int,_std::allocator<int>_> data;
  int local_5c;
  int *local_58;
  vector<int,_std::allocator<int>_> local_50;
  pointer local_38;
  
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_58 = (int *)CONCAT71(local_58._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3a,"void test_1d_dynamic() [X = 1UL]",(bool *)&local_50,(bool *)&local_58);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = (int *)CONCAT44(local_58._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3c,"void test_1d_dynamic() [X = 1UL]",(unsigned_long *)&local_50,(int *)&local_58);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3e,"void test_1d_dynamic() [X = 1UL]",(unsigned_long *)&local_50,
             (unsigned_long *)&local_58);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3f,"void test_1d_dynamic() [X = 1UL]",(unsigned_long *)&local_50,
             (unsigned_long *)&local_58);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,1,(allocator_type *)&local_58);
  piVar1 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_5c = 0;
  do {
    local_58 = (int *)0x0;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x47,"void test_1d_dynamic() [X = 1UL]",(unsigned_long *)&local_58,&local_5c);
    local_58 = piVar1 + local_5c;
    local_38 = local_58;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x49,"void test_1d_dynamic() [X = 1UL]",&local_58,&local_38);
    t = piVar1 + local_5c;
    *t = local_5c;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x4d,"void test_1d_dynamic() [X = 1UL]",t,&local_5c);
    if ((ulong)((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)(long)local_5c) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar2);
    }
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i)))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x50,"void test_1d_dynamic() [X = 1UL]",
               local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + local_5c,&local_5c);
    local_5c = local_5c + 1;
  } while (local_5c == 0);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_1d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn>, dimensions<1>, dimensions<0>
    > const l{{X}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    vector<int> data(l[0]);
    int* dptr = data.data();

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(l.index(i))), i); 
    }
}